

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

bool llvm::APInt::tcIsZero(WordType *src,uint parts)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (parts == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (src[uVar2] == 0);
  return parts <= uVar2;
}

Assistant:

bool APInt::tcIsZero(const WordType *src, unsigned parts) {
  for (unsigned i = 0; i < parts; i++)
    if (src[i])
      return false;

  return true;
}